

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_handshake_step(mbedtls_ssl_context *ssl)

{
  int iVar1;
  
  if ((ssl == (mbedtls_ssl_context *)0x0) || (ssl->conf == (mbedtls_ssl_config *)0x0)) {
    return -0x7100;
  }
  if (((ssl->conf->field_0x174 & 1) == 0) &&
     (iVar1 = mbedtls_ssl_handshake_client_step(ssl), (ssl->conf->field_0x174 & 1) == 0)) {
    return iVar1;
  }
  iVar1 = mbedtls_ssl_handshake_server_step(ssl);
  return iVar1;
}

Assistant:

int mbedtls_ssl_handshake_step( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
        ret = mbedtls_ssl_handshake_client_step( ssl );
#endif
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
        ret = mbedtls_ssl_handshake_server_step( ssl );
#endif

    return( ret );
}